

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket.c
# Opt level: O3

ufile_error bucket_request_do(CURL *curl,char *url,bucket_resp *br)

{
  cJSON *pcVar1;
  int iVar2;
  cJSON *item;
  char *pcVar3;
  uint uVar4;
  ufile_error uVar5;
  http_body response_body;
  char tmp [2048];
  undefined8 local_858;
  char *pcStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  char local_838 [2056];
  
  curl_easy_setopt(curl,0x2712,url);
  curl_easy_setopt(curl,0x2734,"GET");
  if (_g_debug_open != 0) {
    curl_easy_setopt(curl,0x29,1);
  }
  curl_easy_setopt(curl,99,1);
  local_848 = 0;
  uStack_840 = 0;
  local_858 = 0;
  pcStack_850 = (char *)0x0;
  memset(local_838,0,0x800);
  local_848 = 0x800;
  pcStack_850 = local_838;
  curl_easy_setopt(curl,0x4e2b,http_write_cb);
  curl_easy_setopt(curl,0x2711,&local_858);
  curl_do(curl);
  item = cJSON_Parse(pcStack_850);
  if (item == (cJSON *)0x0) {
    uVar4 = 0xfffffff6;
    pcVar3 = cJSON_GetErrorPtr();
  }
  else {
    for (pcVar1 = item->child; pcVar1 != (cJSON *)0x0; pcVar1 = pcVar1->next) {
      pcVar3 = pcVar1->string;
      iVar2 = strcmp(pcVar3,"RetCode");
      if (iVar2 == 0) {
        br->code = pcVar1->valueint;
      }
      else {
        iVar2 = strcmp(pcVar3,"Message");
        if (iVar2 == 0) {
          pcVar3 = ufile_strconcat(pcVar1->valuestring,0);
          br->msg = pcVar3;
        }
      }
    }
    if ((_g_debug_open != 0) && (br->code != 0)) {
      printf("RetCode=%d;\nmessage=%s\n",(ulong)(uint)br->code,br->msg);
    }
    cJSON_Delete(item);
    uVar4 = br->code;
    if (uVar4 == 0) {
      pcVar3 = "";
      uVar4 = 0;
    }
    else if (uVar4 - 0x3a9d < 3) {
      pcVar3 = "Operation failed, please try again later.";
    }
    else {
      if ((int)uVar4 < 0x3a9c) {
        if ((int)uVar4 < 0xac) {
          if (uVar4 == 0x96) {
            pcVar3 = anon_var_dwarf_a89;
            goto LAB_00103d3b;
          }
          if (uVar4 == 0x98) {
            pcVar3 = "API error or Service unavailable";
            goto LAB_00103d3b;
          }
          if (uVar4 == 0xab) {
            pcVar3 = "Invalid signature.";
            goto LAB_00103d3b;
          }
        }
        else if ((int)uVar4 < 15000) {
          if (uVar4 == 0xac) {
            pcVar3 = "The account does not exist.";
            goto LAB_00103d3b;
          }
          if (uVar4 == 0xad) {
            pcVar3 = "The account has been restricted.";
            goto LAB_00103d3b;
          }
        }
        else {
          if (uVar4 == 15000) {
            pcVar3 = "Duplicate bucket name, please input again.";
            goto LAB_00103d3b;
          }
          if (uVar4 == 0x3a99) {
            pcVar3 = "Illegal bucket name.";
            goto LAB_00103d3b;
          }
        }
      }
      else if ((int)uVar4 < 0x3abd) {
        if (uVar4 == 0x3a9c) {
          pcVar3 = "This operation request has timed out, please retry later.";
          goto LAB_00103d3b;
        }
        if (uVar4 == 0x3aaf) {
          pcVar3 = "The bucket does not empty, it can\'t delete.";
          goto LAB_00103d3b;
        }
        if (uVar4 == 0x3ab6) {
          pcVar3 = "Your CDN quota is full.";
          goto LAB_00103d3b;
        }
      }
      else if ((int)uVar4 < 0x3acb) {
        if (uVar4 == 0x3abd) {
          pcVar3 = "No permission.";
          goto LAB_00103d3b;
        }
        if (uVar4 == 0x3ac1) {
          pcVar3 = "User has not certified.";
          goto LAB_00103d3b;
        }
      }
      else {
        if (uVar4 == 0x3acb) {
          pcVar3 = "Bucket creation failure, quota is insufficient.";
          goto LAB_00103d3b;
        }
        if (uVar4 == 0x3acc) {
          pcVar3 = "The Token is unbound, it cannot delete.";
          goto LAB_00103d3b;
        }
      }
      pcVar3 = "Internal error, please submit a ticket or contact support.";
    }
  }
LAB_00103d3b:
  uVar5._4_4_ = 0;
  uVar5.code = uVar4;
  uVar5.message = pcVar3;
  return uVar5;
}

Assistant:

static struct ufile_error
bucket_request_do(CURL *curl, const char* url, struct bucket_resp *br){
    struct ufile_error error = NO_ERROR;
    curl_easy_setopt(curl, CURLOPT_URL, url);
    curl_easy_setopt(curl, CURLOPT_CUSTOMREQUEST, "GET");
    if(_g_debug_open != 0){
        curl_easy_setopt(curl, CURLOPT_VERBOSE, 1L);
    }
    curl_easy_setopt(curl, CURLOPT_NOSIGNAL, 1);

    struct http_body response_body;
    memset(&response_body, 0, sizeof(response_body));
    char tmp[2048] = {0}; 
    response_body.buffer_size = 2048;
    response_body.buffer = tmp;
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, &http_write_cb);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &response_body);

    error = curl_do(curl);
    cJSON *json = cJSON_Parse(response_body.buffer);
    if(json==NULL){
        error.code = UFILE_BUCKET_REQ_ERROR_CODE;
        error.message = cJSON_GetErrorPtr();
        return error;
    }
    struct cJSON *item = json->child;
    while(item!=NULL){
        if (strcmp(item->string, "RetCode") == 0){
            br->code = item->valueint;
        }else if(strcmp(item->string, "Message") == 0){
            br->msg = ufile_strconcat(item->valuestring, NULL);
        }
        item=item->next;
    }
    if(_g_debug_open != 0 && br->code !=0){
        printf("RetCode=%d;\nmessage=%s\n", br->code, br->msg);
    }

    cJSON_Delete(json);
    return parse_error(br);
}